

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::write(AsyncPipe *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  ArrayPtr<const_unsigned_char> *pAVar2;
  undefined4 in_register_00000034;
  AsyncPipe *adapterConstructorParams;
  bool bVar3;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> local_68;
  AsyncPipe *local_58;
  ArrayPtr<const_unsigned_char> *local_50;
  AsyncCapabilityStream *local_48;
  AsyncCapabilityStream *s;
  AsyncCapabilityStream *_s320;
  ArrayPtr<const_unsigned_char> *local_30;
  AsyncPipe *local_28;
  AsyncPipe *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  adapterConstructorParams = (AsyncPipe *)CONCAT44(in_register_00000034,__fd);
  local_28 = adapterConstructorParams;
  this_local = (AsyncPipe *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  while( true ) {
    sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    bVar3 = false;
    if (sVar1 != 0) {
      pAVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,0);
      sVar1 = ArrayPtr<const_unsigned_char>::size(pAVar2);
      bVar3 = sVar1 == 0;
    }
    if (!bVar3) break;
    sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    __s320 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,1,sVar1);
    this_local = (AsyncPipe *)_s320;
    pieces_local.ptr = local_30;
  }
  sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  if (sVar1 == 0) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    local_48 = kj::_::readMaybe<kj::AsyncCapabilityStream>(&adapterConstructorParams->state);
    s = local_48;
    if (local_48 == (AsyncCapabilityStream *)0x0) {
      pAVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,0);
      sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
      local_68 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                           ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,1,
                            sVar1);
      newAdaptedPromise<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite,kj::(anonymous_namespace)::AsyncPipe&,kj::ArrayPtr<unsigned_char_const>const&,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>>
                ((kj *)this,adapterConstructorParams,pAVar2,&local_68);
    }
    else {
      local_58 = this_local;
      local_50 = pieces_local.ptr;
      (*(local_48->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream[1])
                (this,&(local_48->super_AsyncIoStream).super_AsyncOutputStream,this_local,
                 pieces_local.ptr);
    }
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    while (pieces.size() > 0 && pieces[0].size() == 0) {
      pieces = pieces.slice(1, pieces.size());
    }

    if (pieces.size() == 0) {
      return kj::READY_NOW;
    } else KJ_IF_SOME(s, state) {
      return s.write(pieces);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(
          *this, pieces[0], pieces.slice(1, pieces.size()));
    }
  }